

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFraig(Abc_Ntk_t *pNtk,void *pParams,int fAllNodes,int fExdc)

{
  ulong uVar1;
  char *pcVar2;
  long *plVar3;
  int iVar4;
  Fraig_Man_t *p;
  stmm_table *table;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  Abc_Ntk_t *pNtkNew;
  int *piVar7;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar8;
  Abc_Ntk_t *pAVar9;
  int iVar10;
  long lVar11;
  Abc_Obj_t *pRepr;
  char **local_48;
  Fraig_Man_t *local_40;
  char *local_38;
  
  if (fExdc != 0) {
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) goto LAB_002c4d3d;
    puts("Warning: Networks has no EXDC.");
  }
  fExdc = 0;
LAB_002c4d3d:
  p = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,pParams,fAllNodes,fExdc);
  if (*(int *)((long)pParams + 0x24) != 0) {
    Fraig_ManProveMiter(p);
  }
  if (fExdc == 0) {
    pNtkNew = Abc_NtkFromFraig(p,pNtk);
  }
  else {
    local_40 = p;
    table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    pAVar5 = Abc_AigConst1(pNtk);
    iVar4 = stmm_find_or_add(table,(char *)((ulong)(pAVar5->field_6).pTemp & 0xfffffffffffffffe),
                             &local_48);
    if (iVar4 == 0) {
      *local_48 = (char *)pAVar5;
    }
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar11 = 0;
      do {
        pcVar2 = (char *)pVVar6->pArray[lVar11];
        iVar4 = stmm_find_or_add(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                                 &local_48);
        if (iVar4 == 0) {
          *local_48 = pcVar2;
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar11 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vObjs;
    iVar4 = pVVar6->nSize;
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        pcVar2 = (char *)pVVar6->pArray[lVar11];
        if (((pcVar2 != (char *)0x0) && ((*(uint *)(pcVar2 + 0x14) & 0xf) == 7)) &&
           (*(ulong *)(pcVar2 + 0x40) != 0)) {
          iVar4 = stmm_find_or_add(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                                   &local_48);
          if ((iVar4 == 0) || (*(uint *)(pcVar2 + 0x14) >> 0xc < *(uint *)(*local_48 + 0x14) >> 0xc)
             ) {
            *local_48 = pcVar2;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pNtk->vObjs;
        iVar4 = pVVar6->nSize;
      } while (lVar11 < iVar4);
    }
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    iVar10 = 8;
    if (6 < iVar4 - 1U) {
      iVar10 = iVar4;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar10;
    if (iVar10 == 0) {
      __s = (void **)0x0;
    }
    else {
      __s = (void **)malloc((long)iVar10 << 3);
    }
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar4;
    memset(__s,0,(long)iVar4 << 3);
    pVVar8 = pNtk->vObjs;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        pcVar2 = (char *)pVVar8->pArray[lVar11];
        if (((pcVar2 != (char *)0x0) && ((*(uint *)(pcVar2 + 0x14) & 0xf) == 7)) &&
           (*(ulong *)(pcVar2 + 0x40) != 0)) {
          iVar4 = stmm_lookup(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                              &local_38);
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
                          ,0x19a,"Abc_Ntk_t *Abc_NtkFromFraig2(Fraig_Man_t *, Abc_Ntk_t *)");
          }
          if (pcVar2 != local_38) {
            iVar4 = *(int *)(pcVar2 + 0x10);
            if (((long)iVar4 < 0) || (pVVar6->nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            pVVar6->pArray[iVar4] = local_38;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar8 = pNtk->vObjs;
      } while (lVar11 < pVVar8->nSize);
    }
    stmm_free_table(table);
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_AigSetNodePhases(pNtk);
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar4 + 500;
      iVar10 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar10) {
        piVar7 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar7;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar10;
      }
      if (-500 < iVar4) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar10;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    pVVar8 = pNtk->vCos;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        plVar3 = (long *)pVVar8->pArray[lVar11];
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar11,(char *)0x0);
        }
        Abc_NtkFromFraig2_rec
                  (pNtkNew,*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
                   ,pVVar6);
        lVar11 = lVar11 + 1;
        pVVar8 = pNtk->vCos;
      } while (lVar11 < pVVar8->nSize);
    }
    Extra_ProgressBarStop(p_00);
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
    Abc_NtkFinalize(pNtk,pNtkNew);
    p = local_40;
  }
  Fraig_ManFree(p);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar9 = Abc_NtkDup(pNtk->pExdc);
    pNtkNew->pExdc = pAVar9;
  }
  iVar4 = Abc_NtkCheck(pNtkNew);
  if (iVar4 == 0) {
    puts("Abc_NtkFraig: The network check has failed.");
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraig( Abc_Ntk_t * pNtk, void * pParams, int fAllNodes, int fExdc )
{
    Fraig_Params_t * pPars = (Fraig_Params_t *)pParams;
    Abc_Ntk_t * pNtkNew;
    Fraig_Man_t * pMan; 
    // check if EXDC is present
    if ( fExdc && pNtk->pExdc == NULL )
        fExdc = 0, printf( "Warning: Networks has no EXDC.\n" );
    // perform fraiging
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtk, pParams, fAllNodes, fExdc ); 
    // add algebraic choices
//    if ( pPars->fChoicing )
//        Fraig_ManAddChoices( pMan, 0, 6 );
    // prove the miter if asked to
    if ( pPars->fTryProve )
        Fraig_ManProveMiter( pMan );
    // reconstruct FRAIG in the new network
    if ( fExdc ) 
        pNtkNew = Abc_NtkFromFraig2( pMan, pNtk );
    else
        pNtkNew = Abc_NtkFromFraig( pMan, pNtk );
    Fraig_ManFree( pMan );
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraig: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}